

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_defaults_add_unres
              (lyd_node **root,int options,ly_ctx *ctx,lyd_node *data_tree,lyd_node *act_notif,
              unres_data *unres)

{
  lyd_node *plVar1;
  int iVar2;
  LY_ERR *pLVar3;
  lyd_node **local_70;
  int local_64;
  lyd_node *plStack_60;
  int ret;
  lyd_node *data_tree_parent;
  lyd_node *data_tree_sibling;
  lyd_node *msg_parent;
  lyd_node *msg_sibling;
  unres_data *unres_local;
  lyd_node *act_notif_local;
  lyd_node *data_tree_local;
  ly_ctx *ctx_local;
  lyd_node **pplStack_18;
  int options_local;
  lyd_node **root_local;
  
  msg_parent = (lyd_node *)0x0;
  data_tree_sibling = (lyd_node *)0x0;
  data_tree_parent = (lyd_node *)0x0;
  plStack_60 = (lyd_node *)0x0;
  local_64 = 1;
  unres_local = (unres_data *)act_notif;
  act_notif_local = data_tree;
  data_tree_local = (lyd_node *)ctx;
  ctx_local._4_4_ = options;
  pplStack_18 = root;
  if (((root == (lyd_node **)0x0) || (unres == (unres_data *)0x0)) || ((options & 0x100U) != 0)) {
    __assert_fail("root && unres && !(options & LYD_OPT_ACT_NOTIF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x1872,
                  "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                 );
  }
  if ((data_tree != (lyd_node *)0x0) && (data_tree->prev->next != (lyd_node *)0x0)) {
    __assert_fail("!data_tree || !data_tree->prev->next",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x1873,
                  "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                 );
  }
  if (((options & 0x1000U) != 0) && (*root == (lyd_node *)0x0)) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EINVAL;
    ly_log(LY_LLERR,
           "Cannot add default values for one module (LYD_OPT_NOSIBLINGS) without any data.");
    return 1;
  }
  if ((options & 0x70U) == 0) {
    if ((*root != (lyd_node *)0x0) && ((*root)->parent != (lyd_node *)0x0)) {
      ctx_local._4_4_ = options | 0x1000;
      data_tree_local = (lyd_node *)0x0;
    }
  }
  else {
    if (*root == (lyd_node *)0x0) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EINVAL;
      ly_log(LY_LLERR,
             "Cannot add default values to RPC, RPC reply, and notification without at least the empty container."
            );
      return 1;
    }
    if ((((options & 0x10U) != 0) && (act_notif == (lyd_node *)0x0)) &&
       ((*root)->schema->nodetype != LYS_RPC)) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EINVAL;
      ly_log(LY_LLERR,"Not valid RPC/action data.");
      return 1;
    }
    if ((((options & 0x20U) != 0) && (act_notif == (lyd_node *)0x0)) &&
       ((*root)->schema->nodetype != LYS_RPC)) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EINVAL;
      ly_log(LY_LLERR,"Not valid reply data.");
      return 1;
    }
    if ((((options & 0x40U) != 0) && (act_notif == (lyd_node *)0x0)) &&
       ((*root)->schema->nodetype != LYS_NOTIF)) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EINVAL;
      ly_log(LY_LLERR,"Not valid notification data.");
      return 1;
    }
  }
  local_70 = root;
  if (act_notif != (lyd_node *)0x0) {
    local_70 = (lyd_node **)&unres_local;
  }
  iVar2 = lyd_wd_add(local_70,(ly_ctx *)data_tree_local,unres,ctx_local._4_4_);
  if (iVar2 == 0) {
    if ((unres == (unres_data *)0x0) || (unres->count == 0)) {
      local_64 = 0;
    }
    else {
      if (*pplStack_18 == (lyd_node *)0x0) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
               ,0x189b);
        return 1;
      }
      if ((act_notif_local != (lyd_node *)0x0) && ((ctx_local._4_4_ & 0x70) != 0)) {
        if (unres_local == (unres_data *)0x0) {
          plStack_60 = (lyd_node *)0x0;
          msg_parent = *pplStack_18;
          data_tree_parent = act_notif_local;
        }
        else {
          if (*(long *)&unres_local[1].count == 0) {
            __assert_fail("act_notif->parent",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                          ,0x18a3,
                          "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                         );
          }
          data_tree_sibling = (lyd_node *)0x0;
          msg_parent = *pplStack_18;
          plStack_60 = (lyd_node *)0x0;
          data_tree_parent = act_notif_local;
          plVar1 = data_tree_parent;
          do {
            do {
              data_tree_parent = plVar1;
              if (data_tree_parent == (lyd_node *)0x0) goto LAB_0018ec09;
              while ((data_tree_parent != (lyd_node *)0x0 &&
                     ((data_tree_parent->schema != msg_parent->schema ||
                      ((msg_parent->schema->nodetype == LYS_LIST &&
                       (iVar2 = lyd_list_equal(data_tree_parent,msg_parent,0,0,0), iVar2 == 0)))))))
              {
                data_tree_parent = data_tree_parent->next;
              }
              plVar1 = data_tree_parent;
            } while (data_tree_parent == (lyd_node *)0x0);
            plStack_60 = data_tree_parent;
            plVar1 = data_tree_parent->child;
            if (msg_parent->child == (lyd_node *)0x0) {
              pLVar3 = ly_errno_location();
              *pLVar3 = LY_EINT;
              ly_log(LY_LLERR,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                     ,0x18bc);
              data_tree_parent = plVar1;
              goto LAB_0018ed4d;
            }
            data_tree_sibling = msg_parent;
            msg_parent = msg_parent->child;
            while (msg_parent->schema->nodetype == LYS_LEAF) {
              if (msg_parent->next == (lyd_node *)0x0) {
                pLVar3 = ly_errno_location();
                *pLVar3 = LY_EINT;
                ly_log(LY_LLERR,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                       ,0x18c4);
                data_tree_parent = plVar1;
                goto LAB_0018ed4d;
              }
              msg_parent = msg_parent->next;
            }
          } while ((msg_parent->schema->nodetype & (LYS_ACTION|LYS_NOTIF)) == LYS_UNKNOWN);
          if ((lys_node *)**(long **)&unres_local[1].count != data_tree_parent->schema) {
            __assert_fail("act_notif->parent->schema == data_tree_parent->schema",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                          ,0x18ca,
                          "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                         );
          }
          data_tree_parent = plVar1;
          if (msg_parent != (lyd_node *)unres_local) {
            __assert_fail("msg_sibling == act_notif",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                          ,0x18cb,
                          "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                         );
          }
LAB_0018ec09:
          if (plStack_60 == (lyd_node *)0x0) {
            data_tree_parent = act_notif_local;
          }
        }
        lyd_unlink_internal(msg_parent,0);
        if ((plStack_60 == (lyd_node *)0x0) && (data_tree_parent == (lyd_node *)0x0)) {
          __assert_fail("data_tree_parent || data_tree_sibling",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                        ,0x18e1,
                        "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                       );
        }
        if (plStack_60 == (lyd_node *)0x0) {
          if (data_tree_parent->parent != (lyd_node *)0x0) {
            __assert_fail("!data_tree_sibling->parent",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                          ,0x18ee,
                          "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                         );
          }
          msg_parent->prev = data_tree_parent->prev;
          data_tree_parent->prev->next = msg_parent;
          data_tree_parent->prev = msg_parent;
        }
        else {
          if (plStack_60->child == (lyd_node *)0x0) {
            plStack_60->child = msg_parent;
          }
          else {
            plStack_60->child->prev->next = msg_parent;
            msg_parent->prev = plStack_60->child->prev;
            plStack_60->child->prev = msg_parent;
          }
          msg_parent->parent = plStack_60;
        }
      }
      iVar2 = resolve_unres_data(unres,pplStack_18,ctx_local._4_4_);
      if (iVar2 == 0) {
        local_64 = 0;
      }
LAB_0018ed4d:
      if ((act_notif_local != (lyd_node *)0x0) && ((ctx_local._4_4_ & 0x70) != 0)) {
        if (plStack_60 == (lyd_node *)0x0) {
          if (data_tree_parent->prev != msg_parent) {
            __assert_fail("data_tree_sibling->prev == msg_sibling",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                          ,0x1907,
                          "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                         );
          }
          data_tree_parent->prev = msg_parent->prev;
          data_tree_parent->prev->next = (lyd_node *)0x0;
          msg_parent->prev = msg_parent;
        }
        else {
          if (plStack_60->child->prev != msg_parent) {
            __assert_fail("data_tree_parent->child->prev == msg_sibling",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                          ,0x1901,
                          "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                         );
          }
          plStack_60->child->prev = msg_parent->prev;
          plStack_60->child->prev->next = (lyd_node *)0x0;
          msg_parent->prev = msg_parent;
          msg_parent->parent = (lyd_node *)0x0;
        }
        if (data_tree_sibling != (lyd_node *)0x0) {
          if (data_tree_sibling->child == (lyd_node *)0x0) {
            data_tree_sibling->child = msg_parent;
          }
          else {
            data_tree_sibling->child->prev->next = msg_parent;
            msg_parent->prev = data_tree_sibling->child->prev;
            data_tree_sibling->child->prev = msg_parent;
          }
          msg_parent->parent = data_tree_sibling;
        }
      }
    }
    root_local._4_4_ = local_64;
  }
  else {
    root_local._4_4_ = 1;
  }
  return root_local._4_4_;
}

Assistant:

int
lyd_defaults_add_unres(struct lyd_node **root, int options, struct ly_ctx *ctx, const struct lyd_node *data_tree,
                       struct lyd_node *act_notif, struct unres_data *unres)
{
    struct lyd_node *msg_sibling = NULL, *msg_parent = NULL, *data_tree_sibling = NULL, *data_tree_parent = NULL;
    int ret = EXIT_FAILURE;

    assert(root && unres && !(options & LYD_OPT_ACT_NOTIF));
    assert(!data_tree || !data_tree->prev->next);

    if ((options & LYD_OPT_NOSIBLINGS) && !(*root)) {
        LOGERR(LY_EINVAL, "Cannot add default values for one module (LYD_OPT_NOSIBLINGS) without any data.");
        return EXIT_FAILURE;
    }

    if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF)) {
        if (!(*root)) {
            LOGERR(LY_EINVAL, "Cannot add default values to RPC, RPC reply, and notification without at least the empty container.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_RPC) && !act_notif && ((*root)->schema->nodetype != LYS_RPC)) {
            LOGERR(LY_EINVAL, "Not valid RPC/action data.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_RPCREPLY) && !act_notif && ((*root)->schema->nodetype != LYS_RPC)) {
            LOGERR(LY_EINVAL, "Not valid reply data.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_NOTIF) && !act_notif && ((*root)->schema->nodetype != LYS_NOTIF)) {
            LOGERR(LY_EINVAL, "Not valid notification data.");
            return EXIT_FAILURE;
        }
    } else if (*root && (*root)->parent) {
        /* we have inner node, so it will be considered as
         * a root of subtree where to add default nodes and
         * no of its siblings will be affected */
        options |= LYD_OPT_NOSIBLINGS;
        ctx = NULL;
    }

    /* add missing default nodes */
    if (lyd_wd_add((act_notif ? &act_notif : root), ctx, unres, options)) {
        return EXIT_FAILURE;
    }

    /* check leafrefs and/or instids if any */
    if (unres && unres->count) {
        if (!(*root)) {
            LOGINT;
            return EXIT_FAILURE;
        }

        /* temporarily link the additional data tree to the RPC/action/notification */
        if (data_tree && (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF))) {
            if (act_notif) {
                /* fun case */
                assert(act_notif->parent);

                msg_parent = NULL;
                msg_sibling = *root;
                data_tree_parent = NULL;
                data_tree_sibling = (struct lyd_node *)data_tree;
                while (data_tree_sibling) {
                    while (data_tree_sibling) {
                        if ((data_tree_sibling->schema == msg_sibling->schema)
                                && ((msg_sibling->schema->nodetype != LYS_LIST)
                                    || lyd_list_equal(data_tree_sibling, msg_sibling, 0, 0, 0))) {
                            /* match */
                            break;
                        }

                        data_tree_sibling = data_tree_sibling->next;
                    }

                    if (data_tree_sibling) {
                        /* prepare for the new data_tree iteration */
                        data_tree_parent = data_tree_sibling;
                        data_tree_sibling = data_tree_sibling->child;

                        /* find new action sibling to search for later (skip list keys) */
                        if (!msg_sibling->child) {
                            LOGINT;
                            goto unlink_datatree;
                        }
                        msg_parent = msg_sibling;
                        for (msg_sibling = msg_sibling->child;
                                msg_sibling->schema->nodetype == LYS_LEAF;
                                msg_sibling = msg_sibling->next) {
                            if (!msg_sibling->next) {
                                LOGINT;
                                goto unlink_datatree;
                            }
                        }
                        if (msg_sibling->schema->nodetype & (LYS_ACTION | LYS_NOTIF)) {
                            /* we are done */
                            assert(act_notif->parent->schema == data_tree_parent->schema);
                            assert(msg_sibling == act_notif);
                            break;
                        }
                    }
                }

                /* loop ended after the first iteration, set the values correctly */
                if (!data_tree_parent) {
                    data_tree_sibling = (struct lyd_node *)data_tree;
                }

            } else {
                /* easy case */
                data_tree_parent = NULL;
                msg_sibling = *root;
                data_tree_sibling = (struct lyd_node *)data_tree;
            }

            /* unlink msg_sibling if needed (won't do anything otherwise) */
            lyd_unlink_internal(msg_sibling, 0);

            /* now we can link msg_sibling into data_tree_parent or next to data_tree_sibling */
            assert(data_tree_parent || data_tree_sibling);
            if (data_tree_parent) {
                if (!data_tree_parent->child) {
                    data_tree_parent->child = msg_sibling;
                } else {
                    /* last child of data_tree_parent */
                    data_tree_parent->child->prev->next = msg_sibling;
                    msg_sibling->prev = data_tree_parent->child->prev;
                    data_tree_parent->child->prev = msg_sibling;
                }
                msg_sibling->parent = data_tree_parent;
            } else {
                /* last sibling of data_tree_sibling */
                assert(!data_tree_sibling->parent);
                msg_sibling->prev = data_tree_sibling->prev;
                data_tree_sibling->prev->next = msg_sibling;
                data_tree_sibling->prev = msg_sibling;
            }
        }

        if (resolve_unres_data(unres, root, options)) {
            goto unlink_datatree;
        }

        /* we are done */
        ret = EXIT_SUCCESS;

unlink_datatree:
        /* put the trees back in order */
        if (data_tree && (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF))) {
            /* unlink it back */
            if (data_tree_parent) {
                assert(data_tree_parent->child->prev == msg_sibling);
                data_tree_parent->child->prev = msg_sibling->prev;
                data_tree_parent->child->prev->next = NULL;
                msg_sibling->prev = msg_sibling;
                msg_sibling->parent = NULL;
            } else {
                assert(data_tree_sibling->prev == msg_sibling);
                data_tree_sibling->prev = msg_sibling->prev;
                data_tree_sibling->prev->next = NULL;
                msg_sibling->prev = msg_sibling;
            }

            /* link it back, if there is a parent to link to */
            if (msg_parent) {
                /* it must always be last */
                if (!msg_parent->child) {
                    msg_parent->child = msg_sibling;
                } else {
                    msg_parent->child->prev->next = msg_sibling;
                    msg_sibling->prev = msg_parent->child->prev;
                    msg_parent->child->prev = msg_sibling;
                }
                msg_sibling->parent = msg_parent;
            }
        }
    } else {
        /* we are done */
        ret = EXIT_SUCCESS;
    }

    return ret;
}